

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndColumns(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumns *pIVar3;
  ImGuiColumnData *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImU32 col;
  int n_1;
  long lVar8;
  ImGuiCol idx;
  ImGuiID id;
  int n;
  ulong uVar9;
  int column_index;
  long lVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  uint local_bc;
  undefined1 local_b8 [16];
  ulong local_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ImGuiContext *g;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect column_hit_rect;
  
  g = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar3->Count) {
    PopClipRect();
    ImDrawList::ChannelsMerge(pIVar2->DrawList);
  }
  local_bc = pIVar3->Flags;
  fVar13 = (pIVar2->DC).CursorPos.y;
  uVar11 = -(uint)(fVar13 <= pIVar3->LineMaxY);
  local_98 = (float)(~uVar11 & (uint)fVar13 | (uint)pIVar3->LineMaxY & uVar11);
  pIVar3->LineMaxY = local_98;
  (pIVar2->DC).CursorPos.y = local_98;
  if ((local_bc & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->HostCursorMaxPosX;
  }
  if (((local_bc & 1) == 0) && (pIVar2->SkipItems == false)) {
    fVar13 = (pIVar2->ClipRect).Min.y;
    uVar11 = -(uint)(fVar13 <= pIVar3->HostCursorPosY);
    fVar12 = (pIVar2->ClipRect).Max.y;
    if (fVar12 <= local_98) {
      local_98 = fVar12;
    }
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    fVar13 = (float)(~uVar11 & (uint)fVar13 | (uint)pIVar3->HostCursorPosY & uVar11);
    local_a0 = 0xffffffffffffffff;
    lVar10 = 0x24;
    for (uVar9 = 1; iVar1 = pIVar3->Count, (long)uVar9 < (long)iVar1; uVar9 = uVar9 + 1) {
      pIVar4 = (pIVar3->Columns).Data;
      local_b8._0_4_ = (pIVar2->Pos).x;
      fVar12 = GetColumnOffset((int)uVar9);
      local_b8._0_4_ = fVar12 + (float)local_b8._0_4_;
      id = pIVar3->ID + (int)uVar9;
      column_hit_rect.Min.x = (float)local_b8._0_4_ + -4.0;
      local_b8._4_4_ = extraout_XMM0_Db;
      local_b8._8_4_ = extraout_XMM0_Dc;
      local_b8._12_4_ = extraout_XMM0_Dd;
      column_hit_rect.Max.x = (float)local_b8._0_4_ + 4.0;
      column_hit_rect.Max.y = local_98;
      column_hit_rect.Min.y = fVar13;
      KeepAliveID(id);
      bVar7 = IsClippedEx(&column_hit_rect,id,false);
      if (!bVar7) {
        hovered = false;
        held = false;
        if ((local_bc & 2) == 0) {
          ButtonBehavior(&column_hit_rect,id,&hovered,&held,0);
          if (hovered == false) {
            if ((held & 1U) != 0) {
              g->MouseCursor = 4;
              goto LAB_001806ca;
            }
          }
          else {
            g->MouseCursor = 4;
            if ((held & 1U) != 0) {
LAB_001806ca:
              if ((*(byte *)((long)&pIVar4->OffsetNorm + lVar10) & 2) == 0) {
                local_a0 = uVar9;
              }
              local_a0 = local_a0 & 0xffffffff;
            }
          }
        }
        idx = hovered + 0x1b;
        if ((held & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_78.x = (float)(int)(float)local_b8._0_4_;
        local_78.y = local_98;
        local_70.x = local_78.x;
        local_70.y = fVar13 + 1.0;
        ImDrawList::AddLine(pIVar2->DrawList,&local_70,&local_78,col,1.0);
      }
      lVar10 = lVar10 + 0x1c;
    }
    column_index = (int)local_a0;
    if (column_index != -1) {
      if (pIVar3->IsBeingResized == false) {
        lVar10 = 4;
        for (lVar8 = 0; lVar8 <= iVar1; lVar8 = lVar8 + 1) {
          pIVar4 = (pIVar3->Columns).Data;
          *(undefined4 *)((long)&pIVar4->OffsetNorm + lVar10) =
               *(undefined4 *)((long)pIVar4 + lVar10 + -4);
          lVar10 = lVar10 + 0x1c;
        }
      }
      pIVar3->IsBeingResized = true;
      pIVar6 = GImGui;
      local_b8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar12 = GetColumnOffset(column_index + -1);
      fVar13 = (pIVar6->Style).ColumnsMinSpacing;
      fVar12 = fVar12 + fVar13;
      uVar11 = -(uint)(fVar12 <= (float)local_b8._0_4_);
      fVar12 = (float)(~uVar11 & (uint)fVar12 | local_b8._0_4_ & uVar11);
      if ((pIVar3->Flags & 4) != 0) {
        local_b8._4_4_ = local_b8._4_4_ & extraout_XMM0_Db_00;
        local_b8._0_4_ = fVar12;
        local_b8._8_4_ = local_b8._8_4_ & extraout_XMM0_Dc_00;
        local_b8._12_4_ = local_b8._12_4_ & extraout_XMM0_Dd_00;
        local_98 = fVar13;
        fVar13 = GetColumnOffset(column_index + 1);
        fVar12 = (float)local_b8._0_4_;
        if (fVar13 - local_98 <= (float)local_b8._0_4_) {
          fVar12 = fVar13 - local_98;
        }
      }
      SetColumnOffset(column_index,fVar12);
    }
    bVar7 = column_index != -1;
  }
  else {
    bVar7 = false;
  }
  pIVar3->IsBeingResized = bVar7;
  IVar5 = (pIVar3->HostWorkRect).Max;
  (pIVar2->WorkRect).Min = (pIVar3->HostWorkRect).Min;
  (pIVar2->WorkRect).Max = IVar5;
  (pIVar2->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  (pIVar2->DC).CursorPos.x = (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    const ImGuiColumnsFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = columns->HostWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}